

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

qsizetype findLocaleIndexById(QLocaleId localeId)

{
  undefined4 uVar1;
  QLocaleId other;
  ulong in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  qsizetype idx;
  QLocaleData *in_stack_ffffffffffffffc8;
  ulong local_30;
  ulong local_28;
  QLocaleId local_e;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (undefined4)in_RDI;
  local_e.territory_id = (ushort)(in_RDI >> 0x20);
  local_e.language_id = (ushort)in_RDI;
  local_30 = (ulong)locale_index[in_RDI & 0xffff];
  bVar2 = local_e.language_id == 0;
  local_e._0_4_ = uVar1;
  if ((bVar2) || (local_28 = local_30, local_30 != 0)) {
    do {
      other = QLocaleData::id(in_stack_ffffffffffffffc8);
      bVar2 = QLocaleId::acceptScriptTerritory(&local_e,other);
      if (bVar2) {
        local_28 = local_30;
        goto LAB_004c75ae;
      }
      local_30 = local_30 + 1;
      bVar2 = QLocaleId::acceptLanguage(&local_e,locale_data[local_30].m_language_id);
    } while (bVar2);
    local_28 = 0xffffffffffffffff;
  }
LAB_004c75ae:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

static qsizetype findLocaleIndexById(QLocaleId localeId) noexcept
{
    qsizetype idx = locale_index[localeId.language_id];
    // If there are no locales for specified language (so we we've got the
    // default language, which has no associated script or country), give up:
    if (localeId.language_id && idx == 0)
        return idx;

    Q_ASSERT(localeId.acceptLanguage(locale_data[idx].m_language_id));

    do {
        if (localeId.acceptScriptTerritory(locale_data[idx].id()))
            return idx;
        ++idx;
    } while (localeId.acceptLanguage(locale_data[idx].m_language_id));

    return -1;
}